

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

void __thiscall
dxil_spv::Converter::Impl::register_resource_meta_reference
          (Impl *this,MDOperand *operand,ResourceType type,uint index)

{
  MetadataKind MVar1;
  ValueKind VVar2;
  uint uVar3;
  Constant *value;
  ConstantExpr *this_00;
  GlobalVariable *this_01;
  mapped_type *pmVar4;
  LoggingCallback p_Var5;
  void *pvVar6;
  GlobalVariable *local_1028;
  undefined5 uStack_1020;
  undefined3 uStack_101b;
  undefined5 uStack_1018;
  char acStack_1013 [4075];
  
  if (operand->kind != None) {
    MVar1 = LLVMBC::MDOperand::get_metadata_kind(operand);
    if (MVar1 != Constant) {
      p_Var5 = get_thread_log_callback();
      if (p_Var5 != (LoggingCallback)0x0) {
        uStack_1018 = 0x6163206e69;
        builtin_strncpy(acStack_1013,"st<T>.\n",8);
        local_1028 = (GlobalVariable *)0x2064696c61766e49;
        uStack_1020 = 0x2065707974;
        uStack_101b = 0x204449;
        pvVar6 = get_thread_log_callback_userdata();
        (*p_Var5)(pvVar6,Error,(char *)&local_1028);
        std::terminate();
      }
      register_resource_meta_reference();
      std::terminate();
    }
    value = LLVMBC::ConstantAsMetadata::getValue((ConstantAsMetadata *)operand);
    while (value != (Constant *)0x0) {
      this_00 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(&value->super_Value);
      VVar2 = LLVMBC::Value::get_value_kind((Value *)this_00);
      if ((VVar2 != ConstantExpr) ||
         (uVar3 = LLVMBC::ConstantExpr::getOpcode(this_00), uVar3 != 0x70)) {
        this_01 = (GlobalVariable *)LLVMBC::Internal::resolve_proxy(&value->super_Value);
        VVar2 = LLVMBC::Value::get_value_kind((Value *)this_01);
        if (VVar2 != Global) {
          return;
        }
        local_1028 = this_01;
        pmVar4 = std::__detail::
                 _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->llvm_global_variable_to_resource_mapping,
                              (key_type *)&local_1028);
        pmVar4->type = type;
        pmVar4->meta_index = index;
        pmVar4->offset = (Value *)0x0;
        pmVar4->variable = this_01;
        pmVar4->non_uniform = false;
        return;
      }
      value = LLVMBC::ConstantExpr::getOperand(this_00,0);
    }
  }
  return;
}

Assistant:

void Converter::add_local_root_constants(uint32_t register_space, uint32_t register_index, uint32_t num_words)
{
	LocalRootSignatureEntry entry = {};
	entry.type = LocalRootSignatureType::Constants;
	entry.constants.num_words = num_words;
	entry.constants.register_space = register_space;
	entry.constants.register_index = register_index;
	impl->local_root_signature.push_back(entry);
}